

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O2

FT_Char FT_Stream_ReadChar(FT_Stream stream,FT_Error *error)

{
  uchar uVar1;
  unsigned_long uVar2;
  ulong uVar3;
  uchar *puVar4;
  uchar local_19;
  
  local_19 = '\0';
  *error = 0;
  uVar3 = stream->pos;
  if (stream->read == (FT_Stream_IoFunc)0x0) {
    if (stream->size <= uVar3) goto LAB_001379a8;
    puVar4 = stream->base + uVar3;
  }
  else {
    puVar4 = &local_19;
    uVar2 = (*stream->read)(stream,uVar3,puVar4,1);
    if (uVar2 != 1) {
LAB_001379a8:
      *error = 0x55;
      return '\0';
    }
    uVar3 = stream->pos;
  }
  uVar1 = *puVar4;
  stream->pos = uVar3 + 1;
  return uVar1;
}

Assistant:

FT_BASE_DEF( FT_Char )
  FT_Stream_ReadChar( FT_Stream  stream,
                      FT_Error*  error )
  {
    FT_Byte  result = 0;


    FT_ASSERT( stream );

    *error = FT_Err_Ok;

    if ( stream->read )
    {
      if ( stream->read( stream, stream->pos, &result, 1L ) != 1L )
        goto Fail;
    }
    else
    {
      if ( stream->pos < stream->size )
        result = stream->base[stream->pos];
      else
        goto Fail;
    }
    stream->pos++;

    return (FT_Char)result;

  Fail:
    *error = FT_THROW( Invalid_Stream_Operation );
    FT_ERROR(( "FT_Stream_ReadChar:"
               " invalid i/o; pos = 0x%lx, size = 0x%lx\n",
               stream->pos, stream->size ));

    return 0;
  }